

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O2

void __thiscall
VmaBlockMetadata_TLSF::Alloc
          (VmaBlockMetadata_TLSF *this,VmaAllocationRequest *request,VmaSuballocationType type,
          void *userData)

{
  Block *block;
  uint64_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  Block *block_00;
  Block *pBVar4;
  VkDeviceSize VVar5;
  VkDeviceSize VVar6;
  
  block = (Block *)request->allocHandle;
  uVar1 = request->algorithmData;
  if (block != this->m_NullBlock) {
    RemoveFreeBlock(this,block);
  }
  VVar5 = uVar1 - block->offset;
  if (VVar5 == 0) {
    VVar6 = block->size;
  }
  else {
    pBVar4 = block->prevPhysical;
    if ((pBVar4->prevFree == pBVar4) || (VVar6 = pBVar4->size, VVar6 == 0)) {
      block_00 = VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>(&this->m_BlockAllocator);
      block->prevPhysical = block_00;
      pBVar4->nextPhysical = block_00;
      block_00->prevPhysical = pBVar4;
      block_00->nextPhysical = block;
      block_00->size = VVar5;
      block_00->offset = block->offset;
      block_00->prevFree = block_00;
LAB_001a51c0:
      InsertFreeBlock(this,block_00);
    }
    else {
      uVar2 = GetListIndex(this,VVar6);
      pBVar4->size = VVar5 + VVar6;
      uVar3 = GetListIndex(this,VVar5 + VVar6);
      if (uVar2 != uVar3) {
        pBVar4->size = VVar6;
        RemoveFreeBlock(this,pBVar4);
        pBVar4->size = pBVar4->size + VVar5;
        block_00 = pBVar4;
        goto LAB_001a51c0;
      }
      this->m_BlocksFreeSize = this->m_BlocksFreeSize + VVar5;
    }
    VVar6 = block->size - VVar5;
    block->size = VVar6;
    block->offset = block->offset + VVar5;
  }
  VVar5 = request->size;
  if (VVar6 == VVar5) {
    if (block != this->m_NullBlock) goto LAB_001a52a4;
    pBVar4 = VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>(&this->m_BlockAllocator);
    this->m_NullBlock = pBVar4;
    pBVar4->size = 0;
    pBVar4->offset = VVar6 + block->offset;
    pBVar4->prevPhysical = block;
    pBVar4->nextPhysical = (Block *)0x0;
    pBVar4->prevFree = (Block *)0x0;
    (this->m_NullBlock->field_5).nextFree = (Block *)0x0;
    block->nextPhysical = this->m_NullBlock;
  }
  else {
    pBVar4 = VmaPoolAllocator<VmaBlockMetadata_TLSF::Block>::Alloc<>(&this->m_BlockAllocator);
    pBVar4->size = block->size - VVar5;
    pBVar4->offset = block->offset + VVar5;
    pBVar4->prevPhysical = block;
    pBVar4->nextPhysical = block->nextPhysical;
    block->nextPhysical = pBVar4;
    block->size = VVar5;
    if (block != this->m_NullBlock) {
      pBVar4->nextPhysical->prevPhysical = pBVar4;
      pBVar4->prevFree = pBVar4;
      InsertFreeBlock(this,pBVar4);
      goto LAB_001a52a4;
    }
    this->m_NullBlock = pBVar4;
    pBVar4->prevFree = (Block *)0x0;
    (pBVar4->field_5).nextFree = (Block *)0x0;
    this->m_NullBlock->prevFree = (Block *)0x0;
  }
  block->prevFree = block;
LAB_001a52a4:
  (block->field_5).userData = userData;
  if ((this->super_VmaBlockMetadata).m_IsVirtual == false) {
    VmaBlockBufferImageGranularity::AllocPages
              (&this->m_GranularityHandler,*(uint8_t *)&request->customData,block->offset,
               block->size);
  }
  this->m_AllocCount = this->m_AllocCount + 1;
  return;
}

Assistant:

void VmaBlockMetadata_TLSF::Alloc(
    const VmaAllocationRequest& request,
    VmaSuballocationType type,
    void* userData)
{
    VMA_ASSERT(request.type == VmaAllocationRequestType::TLSF);

    // Get block and pop it from the free list
    Block* currentBlock = (Block*)request.allocHandle;
    VkDeviceSize offset = request.algorithmData;
    VMA_ASSERT(currentBlock != VMA_NULL);
    VMA_ASSERT(currentBlock->offset <= offset);

    if (currentBlock != m_NullBlock)
        RemoveFreeBlock(currentBlock);

    VkDeviceSize debugMargin = GetDebugMargin();
    VkDeviceSize misssingAlignment = offset - currentBlock->offset;

    // Append missing alignment to prev block or create new one
    if (misssingAlignment)
    {
        Block* prevBlock = currentBlock->prevPhysical;
        VMA_ASSERT(prevBlock != VMA_NULL && "There should be no missing alignment at offset 0!");

        if (prevBlock->IsFree() && prevBlock->size != debugMargin)
        {
            uint32_t oldList = GetListIndex(prevBlock->size);
            prevBlock->size += misssingAlignment;
            // Check if new size crosses list bucket
            if (oldList != GetListIndex(prevBlock->size))
            {
                prevBlock->size -= misssingAlignment;
                RemoveFreeBlock(prevBlock);
                prevBlock->size += misssingAlignment;
                InsertFreeBlock(prevBlock);
            }
            else
                m_BlocksFreeSize += misssingAlignment;
        }
        else
        {
            Block* newBlock = m_BlockAllocator.Alloc();
            currentBlock->prevPhysical = newBlock;
            prevBlock->nextPhysical = newBlock;
            newBlock->prevPhysical = prevBlock;
            newBlock->nextPhysical = currentBlock;
            newBlock->size = misssingAlignment;
            newBlock->offset = currentBlock->offset;
            newBlock->MarkTaken();

            InsertFreeBlock(newBlock);
        }

        currentBlock->size -= misssingAlignment;
        currentBlock->offset += misssingAlignment;
    }

    VkDeviceSize size = request.size + debugMargin;
    if (currentBlock->size == size)
    {
        if (currentBlock == m_NullBlock)
        {
            // Setup new null block
            m_NullBlock = m_BlockAllocator.Alloc();
            m_NullBlock->size = 0;
            m_NullBlock->offset = currentBlock->offset + size;
            m_NullBlock->prevPhysical = currentBlock;
            m_NullBlock->nextPhysical = VMA_NULL;
            m_NullBlock->MarkFree();
            m_NullBlock->PrevFree() = VMA_NULL;
            m_NullBlock->NextFree() = VMA_NULL;
            currentBlock->nextPhysical = m_NullBlock;
            currentBlock->MarkTaken();
        }
    }
    else
    {
        VMA_ASSERT(currentBlock->size > size && "Proper block already found, shouldn't find smaller one!");

        // Create new free block
        Block* newBlock = m_BlockAllocator.Alloc();
        newBlock->size = currentBlock->size - size;
        newBlock->offset = currentBlock->offset + size;
        newBlock->prevPhysical = currentBlock;
        newBlock->nextPhysical = currentBlock->nextPhysical;
        currentBlock->nextPhysical = newBlock;
        currentBlock->size = size;

        if (currentBlock == m_NullBlock)
        {
            m_NullBlock = newBlock;
            m_NullBlock->MarkFree();
            m_NullBlock->NextFree() = VMA_NULL;
            m_NullBlock->PrevFree() = VMA_NULL;
            currentBlock->MarkTaken();
        }
        else
        {
            newBlock->nextPhysical->prevPhysical = newBlock;
            newBlock->MarkTaken();
            InsertFreeBlock(newBlock);
        }
    }
    currentBlock->UserData() = userData;

    if (debugMargin > 0)
    {
        currentBlock->size -= debugMargin;
        Block* newBlock = m_BlockAllocator.Alloc();
        newBlock->size = debugMargin;
        newBlock->offset = currentBlock->offset + currentBlock->size;
        newBlock->prevPhysical = currentBlock;
        newBlock->nextPhysical = currentBlock->nextPhysical;
        newBlock->MarkTaken();
        currentBlock->nextPhysical->prevPhysical = newBlock;
        currentBlock->nextPhysical = newBlock;
        InsertFreeBlock(newBlock);
    }

    if (!IsVirtual())
        m_GranularityHandler.AllocPages((uint8_t)(uintptr_t)request.customData,
            currentBlock->offset, currentBlock->size);
    ++m_AllocCount;
}